

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-binary.cpp
# Opt level: O0

void __thiscall wasm::WasmBinaryWriter::writeElementSegments(WasmBinaryWriter *this)

{
  BufferWithRandomAccess *pBVar1;
  Module *this_00;
  bool bVar2;
  int32_t start_00;
  uint32_t value;
  vector<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
  *this_01;
  pointer pEVar3;
  Table *pTVar4;
  size_type sVar5;
  reference ppEVar6;
  RefFunc *pRVar7;
  size_type sVar8;
  reference pNVar9;
  mapped_type *pmVar10;
  bool local_1a1;
  U32LEB local_17c;
  undefined1 auStack_178 [8];
  Name name_1;
  _Self local_160;
  iterator __end2;
  iterator __begin2;
  set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_> *__range2;
  U32LEB local_140;
  U32LEB local_13c;
  size_t local_138;
  char *pcStack_130;
  U32LEB local_124;
  Name *local_120;
  Name *name;
  Expression **item_1;
  iterator __end3_1;
  iterator __begin3_1;
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *__range3_1;
  Expression *item;
  iterator __end3;
  iterator __begin3;
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *__range3;
  uintptr_t local_d0;
  U32LEB local_c4;
  U32LEB local_c0;
  uint local_bc;
  size_t sStack_b8;
  uint32_t flags;
  char *pcStack_b0;
  size_t local_a8;
  char *pcStack_a0;
  bool local_97;
  byte local_96;
  byte local_95;
  uint32_t local_94;
  bool hasTableIndex;
  bool usesExpressions;
  bool isPassive;
  reference puStack_90;
  Index tableIdx;
  unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_> *segment;
  iterator __end1;
  iterator __begin1;
  vector<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
  *__range1;
  Type local_68;
  Type funcref;
  int32_t start;
  set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_> needingElemDecl;
  size_t elemCount;
  WasmBinaryWriter *this_local;
  
  needingElemDecl._M_t._M_impl.super__Rb_tree_header._M_node_count =
       std::
       vector<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
       ::size(&this->wasm->elementSegments);
  TableUtils::getFunctionsNeedingElemDeclare
            ((set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_> *)&start,
             this->wasm);
  bVar2 = std::set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>::empty
                    ((set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_> *)&start);
  if (!bVar2) {
    needingElemDecl._M_t._M_impl.super__Rb_tree_header._M_node_count =
         needingElemDecl._M_t._M_impl.super__Rb_tree_header._M_node_count + 1;
  }
  if (needingElemDecl._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
    start_00 = startSection<wasm::BinaryConsts::Section>(this,Element);
    pBVar1 = this->o;
    LEB<unsigned_int,_unsigned_char>::LEB
              ((LEB<unsigned_int,_unsigned_char> *)&funcref,
               (uint)needingElemDecl._M_t._M_impl.super__Rb_tree_header._M_node_count);
    BufferWithRandomAccess::operator<<(pBVar1,funcref.id._0_4_);
    HeapType::HeapType((HeapType *)&__range1,func);
    wasm::Type::Type(&local_68,(HeapType)__range1,Nullable,Inexact);
    this_01 = &this->wasm->elementSegments;
    __end1 = std::
             vector<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
             ::begin(this_01);
    segment = (unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_> *)
              std::
              vector<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
              ::end(this_01);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end1,(__normal_iterator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_*,_std::vector<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>_>
                                       *)&segment), bVar2) {
      puStack_90 = __gnu_cxx::
                   __normal_iterator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_*,_std::vector<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>_>
                   ::operator*(&__end1);
      local_94 = 0;
      pEVar3 = std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>::
               operator->(puStack_90);
      local_95 = IString::isNull(&(pEVar3->table).super_IString);
      pEVar3 = std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>::
               get(puStack_90);
      local_96 = TableUtils::usesExpressions(pEVar3,this->wasm);
      local_97 = false;
      if ((local_95 & 1) == 0) {
        pEVar3 = std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>::
                 operator->(puStack_90);
        local_a8 = (pEVar3->table).super_IString.str._M_len;
        pcStack_a0 = (pEVar3->table).super_IString.str._M_str;
        local_94 = getTableIndex(this,(Name)(pEVar3->table).super_IString.str);
        local_1a1 = true;
        if (local_94 == 0) {
          this_00 = this->wasm;
          pEVar3 = std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>
                   ::operator->(puStack_90);
          sStack_b8 = (pEVar3->table).super_IString.str._M_len;
          pcStack_b0 = (pEVar3->table).super_IString.str._M_str;
          pTVar4 = Module::getTable(this_00,(Name)(pEVar3->table).super_IString.str);
          local_1a1 = wasm::Type::operator!=(&pTVar4->type,&local_68);
        }
        local_97 = local_1a1;
      }
      local_bc = 0;
      if ((local_96 & 1) != 0) {
        local_bc = 4;
      }
      if ((local_95 & 1) == 0) {
        if (local_97 != false) {
          local_bc = local_bc | 2;
        }
      }
      else {
        local_bc = local_bc | 1;
      }
      pBVar1 = this->o;
      LEB<unsigned_int,_unsigned_char>::LEB(&local_c0,local_bc);
      BufferWithRandomAccess::operator<<(pBVar1,local_c0);
      if ((local_95 & 1) == 0) {
        if ((local_97 & 1U) != 0) {
          pBVar1 = this->o;
          LEB<unsigned_int,_unsigned_char>::LEB(&local_c4,local_94);
          BufferWithRandomAccess::operator<<(pBVar1,local_c4);
        }
        pEVar3 = std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>::
                 operator->(puStack_90);
        writeExpression(this,pEVar3->offset);
        BufferWithRandomAccess::operator<<(this->o,'\v');
      }
      if (((local_95 & 1) != 0) || ((local_97 & 1U) != 0)) {
        if ((local_96 & 1) == 0) {
          pBVar1 = this->o;
          LEB<unsigned_int,_unsigned_char>::LEB
                    ((LEB<unsigned_int,_unsigned_char> *)((long)&__range3 + 4),0);
          BufferWithRandomAccess::operator<<(pBVar1,__range3._4_4_);
        }
        else {
          pEVar3 = std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>
                   ::operator->(puStack_90);
          local_d0 = (pEVar3->type).id;
          writeType(this,(Type)local_d0);
        }
      }
      pBVar1 = this->o;
      pEVar3 = std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>::
               operator->(puStack_90);
      sVar5 = std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::size
                        (&pEVar3->data);
      LEB<unsigned_int,_unsigned_char>::LEB
                ((LEB<unsigned_int,_unsigned_char> *)&__range3,(uint)sVar5);
      BufferWithRandomAccess::operator<<(pBVar1,__range3._0_4_);
      if ((local_96 & 1) == 0) {
        pEVar3 = std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>::
                 operator->(puStack_90);
        __end3_1 = std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::begin
                             (&pEVar3->data);
        item_1 = (Expression **)
                 std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::end
                           (&pEVar3->data);
        while (bVar2 = __gnu_cxx::operator!=
                                 (&__end3_1,
                                  (__normal_iterator<wasm::Expression_**,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
                                   *)&item_1), bVar2) {
          name = (Name *)__gnu_cxx::
                         __normal_iterator<wasm::Expression_**,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
                         ::operator*(&__end3_1);
          pRVar7 = Expression::cast<wasm::RefFunc>((Expression *)(name->super_IString).str._M_len);
          local_120 = &pRVar7->func;
          pBVar1 = this->o;
          local_138 = (local_120->super_IString).str._M_len;
          pcStack_130 = (pRVar7->func).super_IString.str._M_str;
          value = getFunctionIndex(this,(Name)(local_120->super_IString).str);
          LEB<unsigned_int,_unsigned_char>::LEB(&local_124,value);
          BufferWithRandomAccess::operator<<(pBVar1,local_124);
          __gnu_cxx::
          __normal_iterator<wasm::Expression_**,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
          ::operator++(&__end3_1);
        }
      }
      else {
        pEVar3 = std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>::
                 operator->(puStack_90);
        __end3 = std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::begin
                           (&pEVar3->data);
        item = (Expression *)
               std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::end
                         (&pEVar3->data);
        while (bVar2 = __gnu_cxx::operator!=
                                 (&__end3,(__normal_iterator<wasm::Expression_**,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
                                           *)&item), bVar2) {
          ppEVar6 = __gnu_cxx::
                    __normal_iterator<wasm::Expression_**,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
                    ::operator*(&__end3);
          writeExpression(this,*ppEVar6);
          BufferWithRandomAccess::operator<<(this->o,'\v');
          __gnu_cxx::
          __normal_iterator<wasm::Expression_**,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
          ::operator++(&__end3);
        }
      }
      __gnu_cxx::
      __normal_iterator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_*,_std::vector<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>_>
      ::operator++(&__end1);
    }
    bVar2 = std::set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>::empty
                      ((set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_> *)&start
                      );
    if (!bVar2) {
      pBVar1 = this->o;
      LEB<unsigned_int,_unsigned_char>::LEB(&local_13c,3);
      BufferWithRandomAccess::operator<<(pBVar1,local_13c);
      pBVar1 = this->o;
      LEB<unsigned_int,_unsigned_char>::LEB(&local_140,0);
      BufferWithRandomAccess::operator<<(pBVar1,local_140);
      pBVar1 = this->o;
      sVar8 = std::set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>::size
                        ((set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_> *)
                         &start);
      LEB<unsigned_int,_unsigned_char>::LEB
                ((LEB<unsigned_int,_unsigned_char> *)((long)&__range2 + 4),(uint)sVar8);
      BufferWithRandomAccess::operator<<(pBVar1,__range2._4_4_);
      __end2 = std::set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>::begin
                         ((set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_> *)
                          &start);
      local_160._M_node =
           (_Base_ptr)
           std::set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>::end
                     ((set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_> *)&start)
      ;
      while (bVar2 = std::operator!=(&__end2,&local_160), bVar2) {
        pNVar9 = std::_Rb_tree_const_iterator<wasm::Name>::operator*(&__end2);
        auStack_178 = (undefined1  [8])(pNVar9->super_IString).str._M_len;
        name_1.super_IString.str._M_len = (size_t)(pNVar9->super_IString).str._M_str;
        pBVar1 = this->o;
        pmVar10 = std::
                  unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>
                  ::operator[](&(this->indexes).functionIndexes,(key_type *)auStack_178);
        LEB<unsigned_int,_unsigned_char>::LEB(&local_17c,*pmVar10);
        BufferWithRandomAccess::operator<<(pBVar1,local_17c);
        std::_Rb_tree_const_iterator<wasm::Name>::operator++(&__end2);
      }
    }
    finishSection(this,start_00);
  }
  std::set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>::~set
            ((set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_> *)&start);
  return;
}

Assistant:

void WasmBinaryWriter::writeElementSegments() {
  size_t elemCount = wasm->elementSegments.size();
  auto needingElemDecl = TableUtils::getFunctionsNeedingElemDeclare(*wasm);
  if (!needingElemDecl.empty()) {
    elemCount++;
  }
  if (elemCount == 0) {
    return;
  }

  auto start = startSection(BinaryConsts::Section::Element);
  o << U32LEB(elemCount);

  Type funcref = Type(HeapType::func, Nullable);
  for (auto& segment : wasm->elementSegments) {
    Index tableIdx = 0;

    bool isPassive = segment->table.isNull();
    // If the segment is MVP, we can use the shorter form.
    bool usesExpressions = TableUtils::usesExpressions(segment.get(), wasm);

    // The table index can and should be elided for active segments of table 0
    // when table 0 has type funcref. This was the only type of segment
    // supported by the MVP, which also did not support table indices in the
    // segment encoding.
    bool hasTableIndex = false;
    if (!isPassive) {
      tableIdx = getTableIndex(segment->table);
      hasTableIndex =
        tableIdx > 0 || wasm->getTable(segment->table)->type != funcref;
    }

    uint32_t flags = 0;
    if (usesExpressions) {
      flags |= BinaryConsts::UsesExpressions;
    }
    if (isPassive) {
      flags |= BinaryConsts::IsPassive;
    } else if (hasTableIndex) {
      flags |= BinaryConsts::HasIndex;
    }

    o << U32LEB(flags);
    if (!isPassive) {
      if (hasTableIndex) {
        o << U32LEB(tableIdx);
      }
      writeExpression(segment->offset);
      o << int8_t(BinaryConsts::End);
    }

    if (isPassive || hasTableIndex) {
      if (usesExpressions) {
        // elemType
        writeType(segment->type);
      } else {
        // MVP elemKind of funcref
        o << U32LEB(0);
      }
    }
    o << U32LEB(segment->data.size());
    if (usesExpressions) {
      for (auto* item : segment->data) {
        writeExpression(item);
        o << int8_t(BinaryConsts::End);
      }
    } else {
      for (auto& item : segment->data) {
        // We've ensured that all items are ref.func.
        auto& name = item->cast<RefFunc>()->func;
        o << U32LEB(getFunctionIndex(name));
      }
    }
  }

  if (!needingElemDecl.empty()) {
    o << U32LEB(BinaryConsts::IsPassive | BinaryConsts::IsDeclarative);
    o << U32LEB(0); // type (indicating funcref)
    o << U32LEB(needingElemDecl.size());
    for (auto name : needingElemDecl) {
      o << U32LEB(indexes.functionIndexes[name]);
    }
  }

  finishSection(start);
}